

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O3

ON_Brep * __thiscall ON_BrepRegion::RegionBoundaryBrep(ON_BrepRegion *this,ON_Brep *brep)

{
  int iVar1;
  uint uVar2;
  ON_BrepRegionTopology *pOVar3;
  ON_BrepFaceSide *pOVar4;
  bool bVar5;
  int iVar6;
  ON_Brep *pOVar7;
  long lVar8;
  bool *pbVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  bool bHasBoundary;
  bool bIsOriented;
  ON_SimpleArray<int> subfi;
  ON_SimpleArray<const_ON_BrepFaceSide_*> FS;
  ON_Workspace ws;
  bool local_79;
  ON_BrepFaceSide *local_78;
  ON_SimpleArray<int> local_70;
  ON_SimpleArray<const_ON_BrepFaceSide_*> local_58;
  ON_Workspace local_40;
  
  ON_Workspace::ON_Workspace(&local_40);
  if ((((this->m_rtop == (ON_BrepRegionTopology *)0x0) ||
       (pOVar7 = this->m_rtop->m_brep, pOVar7 == (ON_Brep *)0x0 || pOVar7 == brep)) ||
      ((pOVar7->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count < 1)
      ) || (sVar10 = (size_t)(this->m_fsi).m_count, (long)sVar10 < 1)) {
    pOVar7 = (ON_Brep *)0x0;
    goto LAB_0040d849;
  }
  local_58._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080d808;
  local_58.m_a = (ON_BrepFaceSide **)0x0;
  local_58.m_count = 0;
  local_58.m_capacity = 0;
  ON_SimpleArray<const_ON_BrepFaceSide_*>::SetCapacity(&local_58,sVar10);
  sVar10 = (size_t)(this->m_fsi).m_count;
  local_70._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
  local_70.m_a = (int *)0x0;
  local_70.m_count = 0;
  local_70.m_capacity = 0;
  if (sVar10 != 0) {
    ON_SimpleArray<int>::SetCapacity(&local_70,sVar10);
    iVar6 = (this->m_fsi).m_count;
    if (0 < iVar6) {
      lVar13 = 0;
      do {
        pOVar3 = this->m_rtop;
        if ((pOVar3 == (ON_BrepRegionTopology *)0x0) || (lVar8 = (long)iVar6, lVar8 <= lVar13))
        goto LAB_0040d865;
        iVar1 = (this->m_fsi).m_a[lVar13];
        if ((((long)iVar1 < 0) ||
            (((pOVar3->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
              super_ON_ClassArray<ON_BrepFaceSide>.m_count <= iVar1 ||
             (pOVar4 = (pOVar3->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
                       super_ON_ClassArray<ON_BrepFaceSide>.m_a, local_78 = pOVar4 + iVar1,
             pOVar4 == (ON_BrepFaceSide *)0x0)))) ||
           ((iVar1 = local_78->m_fi, iVar1 < 0 ||
            ((pOVar7->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
             m_count <= iVar1)))) goto LAB_0040d865;
        if (0 < (long)local_58.m_count) {
          lVar12 = 0;
          do {
            if (iVar1 == local_58.m_a[lVar12]->m_fi) goto LAB_0040d79a;
            lVar12 = lVar12 + 1;
          } while (local_58.m_count != lVar12);
        }
        ON_SimpleArray<const_ON_BrepFaceSide_*>::Append(&local_58,&local_78);
        ON_SimpleArray<int>::Append(&local_70,&local_78->m_fi);
        iVar6 = (this->m_fsi).m_count;
        lVar8 = (long)iVar6;
LAB_0040d79a:
        lVar13 = lVar13 + 1;
      } while (lVar13 < lVar8);
    }
  }
  pOVar7 = ON_Brep::SubBrep(pOVar7,local_70.m_count,local_70.m_a,brep);
  if (pOVar7 == (ON_Brep *)0x0) {
LAB_0040d865:
    pOVar7 = (ON_Brep *)0x0;
  }
  else {
    uVar2 = (pOVar7->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count
    ;
    if (uVar2 != local_58.m_count) goto LAB_0040d865;
    if (0 < (int)uVar2) {
      pbVar9 = &((pOVar7->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                m_a)->m_bRev;
      uVar11 = 0;
      do {
        *pbVar9 = SUB41((uint)local_58.m_a[uVar11]->m_srf_dir >> 0x1f,0);
        uVar11 = uVar11 + 1;
        pbVar9 = pbVar9 + 0xd8;
      } while (uVar2 != uVar11);
    }
    local_78 = (ON_BrepFaceSide *)((ulong)local_78 & 0xffffffffffffff00);
    local_79 = true;
    bVar5 = ON_Brep::IsManifold(pOVar7,(bool *)&local_78,&local_79);
    if (((bVar5) && ((char)local_78 == '\x01')) && (local_79 == false)) {
      if (this->m_type == 0) {
        iVar6 = 1;
      }
      else {
        iVar6 = 2;
        if (this->m_type != 1) goto LAB_0040d868;
      }
      pOVar7->m_is_solid = iVar6;
    }
  }
LAB_0040d868:
  ON_SimpleArray<int>::~ON_SimpleArray(&local_70);
  ON_SimpleArray<const_ON_BrepFaceSide_*>::~ON_SimpleArray(&local_58);
LAB_0040d849:
  ON_Workspace::~ON_Workspace(&local_40);
  return pOVar7;
}

Assistant:

ON_Brep* ON_BrepRegion::RegionBoundaryBrep( ON_Brep* brep ) const
{
  ON_Workspace ws;
  if ( 0 == m_rtop )
    return 0;

  const ON_Brep* rtop_brep = m_rtop->Brep();

  if ( rtop_brep == brep || 0 == rtop_brep || rtop_brep->m_F.Count() <= 0 || m_fsi.Count() <= 0 )
    return 0;

  ON_SimpleArray<const ON_BrepFaceSide*> FS(m_fsi.Count());
  ON_SimpleArray<int> subfi(m_fsi.Count());

  int rfsi, i;
  for ( rfsi = 0; rfsi < m_fsi.Count(); rfsi++ )
  {
    const ON_BrepFaceSide* fs = FaceSide(rfsi);
    if ( 0 == fs || fs->m_fi < 0 || fs->m_fi >= rtop_brep->m_F.Count() )
      return 0;
    for ( i = 0; i < FS.Count(); i++ )
    {
      if ( fs->m_fi == FS[i]->m_fi )
        break;
    }
    if ( i < FS.Count() )
      continue;
    FS.Append(fs);
    subfi.Append(fs->m_fi);
  }

  brep = rtop_brep->SubBrep(subfi.Count(),subfi.Array(),brep);
  if ( !brep )
    return 0;
  if ( brep->m_F.Count() != FS.Count() )
    return 0;
  for ( i = 0; i < FS.Count(); i++ )
  {
    ON_BrepFace& face = brep->m_F[i];
    face.m_bRev = ( FS[i]->m_srf_dir < 0 );
  }

  bool bIsOriented = false;
  bool bHasBoundary = true;
  if ( brep->IsManifold(&bIsOriented,&bHasBoundary) )
  {
    if ( bIsOriented && !bHasBoundary )
    {
      if ( 1 == m_type )
        brep->m_is_solid = 2;
      else if ( 0 == m_type )
        brep->m_is_solid = 1;
    }
  }

  return brep;
}